

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O2

ostream * operator<<(ostream *dest,__int128_t value)

{
  long lVar1;
  long in_RDX;
  long in_RSI;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  sentry s;
  char buffer [128];
  undefined1 local_38 [8];
  
  std::ostream::sentry::sentry((sentry *)&s,dest);
  if (s == (sentry)0x1) {
    lVar3 = -(ulong)(in_RSI != 0) - in_RDX;
    lVar1 = -in_RSI;
    if (-1 < in_RDX) {
      lVar3 = in_RDX;
      lVar1 = in_RSI;
    }
    auVar6._8_8_ = lVar3;
    auVar6._0_8_ = lVar1;
    pcVar4 = buffer + 0x7f;
    do {
      pcVar5 = pcVar4;
      lVar1 = auVar6._8_8_;
      uVar2 = auVar6._0_8_;
      auVar6 = __udivti3(uVar2,lVar1,10,0);
      *pcVar5 = "0123456789"[uVar2 + auVar6._0_8_ * -10];
      pcVar4 = pcVar5 + -1;
    } while (lVar1 != 0 || (ulong)-lVar1 < (ulong)(9 < uVar2));
    if (in_RDX < 0) {
      *pcVar4 = '-';
      pcVar5 = pcVar4;
    }
    lVar3 = (long)((int)local_38 - (int)pcVar5);
    lVar1 = (**(code **)(**(long **)(dest + *(long *)(*(long *)dest + -0x18) + 0xe8) + 0x60))
                      (*(long **)(dest + *(long *)(*(long *)dest + -0x18) + 0xe8),pcVar5,lVar3);
    if (lVar1 != lVar3) {
      std::ios::setstate((int)*(undefined8 *)(*(long *)dest + -0x18) + (int)dest);
    }
  }
  std::ostream::sentry::~sentry((sentry *)&s);
  return dest;
}

Assistant:

std::ostream&
operator<<( std::ostream& dest, __int128_t value )
{
    std::ostream::sentry s( dest );
    if ( s ) {
        __uint128_t tmp = value < 0 ? -value : value;
        char buffer[ 128 ];
        char* d = std::end( buffer );
        do
        {
            -- d;
            *d = "0123456789"[ tmp % 10 ];
            tmp /= 10;
        } while ( tmp != 0 );
        if ( value < 0 ) {
            -- d;
            *d = '-';
        }
        int len = std::end( buffer ) - d;
        if ( dest.rdbuf()->sputn( d, len ) != len ) {
            dest.setstate( std::ios_base::badbit );
        }
    }
    return dest;
}